

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::checkImageFormatRequirements
               (InstanceInterface *vki,VkPhysicalDevice physDevice,VkSampleCountFlagBits sampleCount
               ,VkFormat format,VkImageUsageFlags usage)

{
  int iVar1;
  NotSupportedError *pNVar2;
  undefined1 local_130 [4];
  VkResult imageFormatResult;
  VkImageFormatProperties imageFormatProperties;
  undefined1 local_100 [8];
  VkPhysicalDeviceFeatures features;
  VkImageUsageFlags usage_local;
  VkFormat format_local;
  VkSampleCountFlagBits sampleCount_local;
  VkPhysicalDevice physDevice_local;
  InstanceInterface *vki_local;
  
  features.variableMultisampleRate = usage;
  features.inheritedQueries = format;
  (*vki->_vptr_InstanceInterface[2])(vki,physDevice,local_100);
  if (((features.variableMultisampleRate & 8) != 0) && (features.shaderImageGatherExtended == 0)) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Multisampled storage images are not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
               ,0x201);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  iVar1 = (*vki->_vptr_InstanceInterface[4])
                    (vki,physDevice,(ulong)features.inheritedQueries,1,0,
                     (ulong)features.variableMultisampleRate,0,local_130);
  if (iVar1 == -0xb) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Image format is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
               ,0x208);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((imageFormatProperties.maxMipLevels & sampleCount) != sampleCount) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Requested sample count is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
               ,0x20b);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  return;
}

Assistant:

void checkImageFormatRequirements (const InstanceInterface&		vki,
								   const VkPhysicalDevice		physDevice,
								   const VkSampleCountFlagBits	sampleCount,
								   const VkFormat				format,
								   const VkImageUsageFlags		usage)
{
	VkPhysicalDeviceFeatures	features;
	vki.getPhysicalDeviceFeatures(physDevice, &features);

	if (((usage & VK_IMAGE_USAGE_STORAGE_BIT) != 0) && !features.shaderStorageImageMultisample)
		TCU_THROW(NotSupportedError, "Multisampled storage images are not supported");

	VkImageFormatProperties		imageFormatProperties;
	const VkResult				imageFormatResult		= vki.getPhysicalDeviceImageFormatProperties(
		physDevice, format, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_OPTIMAL, usage, (VkImageCreateFlags)0, &imageFormatProperties);

	if (imageFormatResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
		TCU_THROW(NotSupportedError, "Image format is not supported");

	if ((imageFormatProperties.sampleCounts & sampleCount) != sampleCount)
		TCU_THROW(NotSupportedError, "Requested sample count is not supported");
}